

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void test_union_intersection(void)

{
  bitset_t *b1;
  bitset_t *b2;
  undefined8 uVar1;
  size_t sVar2;
  
  b1 = bitset_create();
  b2 = bitset_create();
  for (sVar2 = 1; sVar2 != 0x7d1; sVar2 = sVar2 + 2) {
    bitset_set(b1,sVar2 - 1);
    bitset_set(b2,sVar2);
  }
  bitset_inplace_symmetric_difference(b1,b2);
  sVar2 = bitset_count(b1);
  if (sVar2 == 2000) {
    bitset_inplace_symmetric_difference(b1,b2);
    sVar2 = bitset_count(b1);
    if (sVar2 == 1000) {
      bitset_inplace_difference(b1,b2);
      sVar2 = bitset_count(b1);
      if (sVar2 == 1000) {
        bitset_inplace_union(b1,b2);
        sVar2 = bitset_count(b1);
        if (sVar2 == 2000) {
          bitset_inplace_intersection(b1,b2);
          sVar2 = bitset_count(b1);
          if (sVar2 == 1000) {
            bitset_inplace_difference(b1,b2);
            sVar2 = bitset_count(b1);
            if (sVar2 == 0) {
              bitset_inplace_union(b1,b2);
              bitset_inplace_difference(b2,b1);
              sVar2 = bitset_count(b2);
              if (sVar2 == 0) {
                bitset_free(b1);
                bitset_free(b2);
                return;
              }
              uVar1 = 0x8c;
            }
            else {
              uVar1 = 0x89;
            }
          }
          else {
            uVar1 = 0x87;
          }
        }
        else {
          uVar1 = 0x85;
        }
      }
      else {
        uVar1 = 0x83;
      }
    }
    else {
      uVar1 = 0x81;
    }
  }
  else {
    uVar1 = 0x7f;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_union_intersection",uVar1);
  exit(1);
}

Assistant:

void test_union_intersection() {
  bitset_t *b1 = bitset_create();
  bitset_t *b2 = bitset_create();

  for (int k = 0; k < 1000; ++k) {
    bitset_set(b1, 2 * k);
    bitset_set(b2, 2 * k + 1);
  }
  // calling xor twice should leave things unchanged
  bitset_inplace_symmetric_difference(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 2000);
  bitset_inplace_symmetric_difference(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 1000);
  bitset_inplace_difference(b1, b2); // should make no difference
  TEST_ASSERT(bitset_count(b1) == 1000);
  bitset_inplace_union(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 2000);
  bitset_inplace_intersection(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 1000);
  bitset_inplace_difference(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 0);
  bitset_inplace_union(b1, b2);
  bitset_inplace_difference(b2, b1);
  TEST_ASSERT(bitset_count(b2) == 0);
  bitset_free(b1);
  bitset_free(b2);
}